

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  _Rb_tree_node_base *__k;
  bool bVar1;
  __type _Var2;
  ParseArgumentStatus PVar3;
  Mode MVar4;
  ostream *poVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  LogMessage *pLVar8;
  size_type sVar9;
  long lVar10;
  ParseArgumentStatus PVar11;
  char *pcVar12;
  CommandLineInterface *pCVar13;
  CommandLineInterface *this_00;
  int iVar14;
  pointer directive;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string value;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pCVar13 = this;
  std::__cxx11::string::assign((char *)this);
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar10 = 1; lVar10 < argc; lVar10 = lVar10 + 1) {
    pcVar12 = argv[lVar10];
    pCVar13 = (CommandLineInterface *)&name;
    if (*pcVar12 == '@') {
      this_00 = (CommandLineInterface *)&name;
      std::__cxx11::string::string((string *)&name,pcVar12 + 1,(allocator *)&value);
      bVar1 = ExpandArgumentFile(this_00,&name,&arguments);
      std::__cxx11::string::~string((string *)&name);
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to open argument file: ");
        poVar5 = std::operator<<(poVar5,argv[lVar10] + 1);
        std::endl<char,std::char_traits<char>>(poVar5);
        PVar11 = PARSE_ARGUMENT_FAIL;
        goto LAB_0027e782;
      }
    }
    else {
      std::__cxx11::string::string((string *)&name,pcVar12,(allocator *)&value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  if (arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    PrintHelpText(this);
    PVar11 = PARSE_ARGUMENT_DONE_AND_EXIT;
  }
  else {
    PVar11 = PARSE_ARGUMENT_FAIL;
    iVar14 = 0;
    do {
      if ((ulong)((long)arguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)arguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)iVar14) {
        bVar1 = false;
        for (p_Var7 = (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var7 !=
            &(this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          __k = p_Var7 + 1;
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&(this->plugins_)._M_t,(key_type *)__k);
          if ((_Rb_tree_header *)iVar6._M_node ==
              &(this->plugins_)._M_t._M_impl.super__Rb_tree_header) {
            for (directive = (this->output_directives_).
                             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                directive !=
                (this->output_directives_).
                super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ._M_impl.super__Vector_impl_data._M_finish; directive = directive + 1) {
              if (directive->generator == (CodeGenerator *)0x0) {
                anon_unknown_4::PluginName(&name,&this->plugin_prefix_,&directive->name);
                _Var2 = std::operator==(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__k);
                std::__cxx11::string::~string((string *)&name);
                if (_Var2) goto LAB_0027e91b;
              }
            }
            poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
            std::__cxx11::string::substr((ulong)&local_50,(ulong)__k);
            std::operator+(&value,"--",&local_50);
            std::operator+(&name,&value,"_opt");
            poVar5 = std::operator<<(poVar5,(string *)&name);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::~string((string *)&value);
            std::__cxx11::string::~string((string *)&local_50);
            bVar1 = true;
          }
LAB_0027e91b:
        }
        PVar11 = PARSE_ARGUMENT_FAIL;
        if (bVar1) break;
        if (((this->proto_path_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->proto_path_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&name,(char (*) [1])0x3cb5b9,(char (*) [2])0x428e32);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&this->proto_path_,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&name);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&name);
        }
        MVar4 = this->mode_;
        switch(MVar4) {
        case MODE_COMPILE:
          if ((this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0027ea76:
            if (((this->output_directives_).
                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 (this->output_directives_).
                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               ((this->descriptor_set_out_name_)._M_string_length == 0)) {
              pcVar12 = "Missing output directives.";
              goto LAB_0027eb01;
            }
            goto LAB_0027eaca;
          }
LAB_0027e9f1:
          pcVar12 = "Missing input file.";
          goto LAB_0027eb01;
        case MODE_ENCODE:
        case MODE_PRINT:
switchD_0027e9ab_caseD_1:
          if (((this->input_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->input_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0027e9f1;
          break;
        case MODE_DECODE:
          if ((this->codec_type_)._M_string_length != 0) goto switchD_0027e9ab_caseD_1;
          pcVar12 = "When using --decode_raw, no input files should be given.";
          if (((this->input_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->input_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             ((this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0027eb01;
          if ((this->dependency_out_name_)._M_string_length == 0) goto LAB_0027eaca;
          goto LAB_0027ea60;
        default:
          internal::LogMessage::LogMessage
                    ((LogMessage *)&name,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x613);
          pLVar8 = internal::LogMessage::operator<<((LogMessage *)&name,"Unexpected mode: ");
          pLVar8 = internal::LogMessage::operator<<(pLVar8,this->mode_);
          internal::LogFinisher::operator=((LogFinisher *)&value,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)&name);
          MVar4 = this->mode_;
          if (MVar4 == MODE_COMPILE) goto LAB_0027ea76;
        }
        if ((this->dependency_out_name_)._M_string_length == 0) {
          if (MVar4 == MODE_ENCODE) {
LAB_0027eb1a:
            sVar9 = (this->descriptor_set_out_name_)._M_string_length;
            if ((sVar9 == 0 & this->imports_in_descriptor_set_) == 1) {
              poVar5 = std::operator<<((ostream *)&std::cerr,
                                       "--include_imports only makes sense when combined with --descriptor_set_out."
                                      );
              std::endl<char,std::char_traits<char>>(poVar5);
              sVar9 = (this->descriptor_set_out_name_)._M_string_length;
            }
            PVar11 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
            if ((this->source_info_in_descriptor_set_ == true) && (sVar9 == 0)) {
              poVar5 = std::operator<<((ostream *)&std::cerr,
                                       "--include_source_info only makes sense when combined with --descriptor_set_out."
                                      );
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            break;
          }
LAB_0027eaca:
          if (this->deterministic_output_ == false) {
            if (((this->dependency_out_name_)._M_string_length == 0) ||
               ((ulong)((long)(this->input_files_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->input_files_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x21)) goto LAB_0027eb1a;
            pcVar12 = "Can only process one input file when using --dependency_out=FILE.";
          }
          else {
            pcVar12 = "Can only use --deterministic_output with --encode.";
          }
        }
        else {
LAB_0027ea60:
          pcVar12 = "Can only use --dependency_out=FILE when generating code.";
        }
LAB_0027eb01:
        poVar5 = std::operator<<((ostream *)&std::cerr,pcVar12);
        std::endl<char,std::char_traits<char>>(poVar5);
        break;
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      value.field_2._M_local_buf[0] = '\0';
      bVar1 = ParseArgument(pCVar13,arguments.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar14]._M_dataplus.
                                    _M_p,&name,&value);
      if (bVar1) {
        iVar14 = iVar14 + 1;
        if (((long)arguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)arguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5 != (long)iVar14) &&
           (*arguments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar14]._M_dataplus._M_p != '-')) {
          std::__cxx11::string::_M_assign((string *)&value);
          goto LAB_0027e712;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
        poVar5 = std::operator<<(poVar5,(string *)&name);
        std::endl<char,std::char_traits<char>>(poVar5);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&name,"--decode");
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "To decode an unknown message, use --decode_raw.");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        bVar1 = false;
        PVar11 = PARSE_ARGUMENT_FAIL;
      }
      else {
LAB_0027e712:
        PVar3 = InterpretArgument(this,&name,&value);
        bVar1 = PVar3 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
        if (!bVar1) {
          PVar11 = PVar3;
        }
        iVar14 = iVar14 + 1;
      }
      std::__cxx11::string::~string((string *)&value);
      pCVar13 = (CommandLineInterface *)&name;
      std::__cxx11::string::~string((string *)&name);
    } while (bVar1);
  }
LAB_0027e782:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arguments);
  return PVar11;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<std::string, std::string>::const_iterator i =
           plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j =
             output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        std::string plugin_name = PluginName(plugin_prefix_, j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      PROTOBUF_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      GOOGLE_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}